

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<std::complex<long_double>_>::GetSub
          (TPZMatrix<std::complex<long_double>_> *this,TPZVec<long> *indices,
          TPZFMatrix<std::complex<long_double>_> *block)

{
  long lVar1;
  int64_t iVar2;
  long *plVar3;
  complex<long_double> *pcVar4;
  TPZVec<long> *in_RSI;
  long *in_RDI;
  int64_t jel;
  int64_t iel;
  int64_t nel;
  undefined8 local_58;
  int64_t in_stack_ffffffffffffffb0;
  int64_t in_stack_ffffffffffffffb8;
  TPZFMatrix<std::complex<long_double>_> *in_stack_ffffffffffffffc0;
  long local_30;
  long local_28;
  
  iVar2 = TPZVec<long>::NElements(in_RSI);
  for (local_28 = 0; local_28 < iVar2; local_28 = local_28 + 1) {
    for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
      plVar3 = TPZVec<long>::operator[](in_RSI,local_28);
      lVar1 = *plVar3;
      plVar3 = TPZVec<long>::operator[](in_RSI,local_30);
      (**(code **)(*in_RDI + 0x120))(&local_58,in_RDI,lVar1,*plVar3);
      pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()
                         (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                          in_stack_ffffffffffffffb0);
      *(undefined8 *)pcVar4->_M_value = local_58;
      *(int64_t *)(pcVar4->_M_value + 8) = in_stack_ffffffffffffffb0;
      *(int64_t *)(pcVar4->_M_value + 0x10) = in_stack_ffffffffffffffb8;
      *(TPZFMatrix<std::complex<long_double>_> **)(pcVar4->_M_value + 0x18) =
           in_stack_ffffffffffffffc0;
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::GetSub(const TPZVec<int64_t> &indices,TPZFMatrix<TVar> &block) const
{
    int64_t nel = indices.NElements();
    int64_t iel,jel;
    for(iel=0; iel<nel; iel++)
    {
		for(jel=0; jel<nel; jel++)
		{
			block(iel,jel) = GetVal(indices[iel],indices[jel]);
		}
    }
	
}